

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

Token nexttoken(Context_conflict *ctx)

{
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  uint line;
  undefined8 uStack_38;
  
  if (ctx->pushedback == 0) {
    uStack_38 = in_RAX;
    pcVar2 = preprocessor_nexttoken(ctx->preprocessor,&ctx->tokenlen,&ctx->tokenval);
    ctx->token = pcVar2;
    iVar1 = preprocessor_outofmemory(ctx->preprocessor);
    if (iVar1 == 0) {
      do {
        pcVar2 = preprocessor_sourcepos(ctx->preprocessor,(uint *)((long)&uStack_38 + 4));
        ctx->current_file = pcVar2;
        ctx->current_position = uStack_38._4_4_;
        if (ctx->tokenval == TOKEN_PREPROCESSING_ERROR) {
          pcVar2 = ctx->token;
        }
        else {
          if (ctx->tokenval != TOKEN_BAD_CHARS) goto LAB_001232d7;
          pcVar2 = "Bad characters in source file";
        }
        failf(ctx,"%s",pcVar2);
        pcVar2 = preprocessor_nexttoken(ctx->preprocessor,&ctx->tokenlen,&ctx->tokenval);
        ctx->token = pcVar2;
        iVar1 = preprocessor_outofmemory(ctx->preprocessor);
      } while (iVar1 == 0);
    }
    ctx->token = (char *)0x0;
    ctx->tokenlen = 0;
    ctx->tokenval = TOKEN_EOI;
  }
  else {
    ctx->pushedback = 0;
  }
LAB_001232d7:
  return ctx->tokenval;
}

Assistant:

static Token nexttoken(Context *ctx)
{
    if (ctx->pushedback)
        ctx->pushedback = 0;
    else
    {
        while (1)
        {
            ctx->token = preprocessor_nexttoken(ctx->preprocessor,
                                                &ctx->tokenlen,
                                                &ctx->tokenval);

            if (preprocessor_outofmemory(ctx->preprocessor))
            {
                ctx->tokenval = TOKEN_EOI;
                ctx->token = NULL;
                ctx->tokenlen = 0;
                break;
            } // if

            unsigned int line;
            ctx->current_file = preprocessor_sourcepos(ctx->preprocessor,&line);
            ctx->current_position = (int) line;

            if (ctx->tokenval == TOKEN_BAD_CHARS)
            {
                fail(ctx, "Bad characters in source file");
                continue;
            } // else if

            else if (ctx->tokenval == TOKEN_PREPROCESSING_ERROR)
            {
                fail(ctx, ctx->token);
                continue;
            } // else if

            break;
        } // while
    } // else

    print_debug_token(ctx->token, ctx->tokenlen, ctx->tokenval);
    return ctx->tokenval;
}